

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O1

int32_t dtl_json_dump(dtl_dv_t *dv,FILE *fh,int32_t indent,_Bool sortKeys)

{
  dtl_json_writer_t writer;
  dtl_json_writer_t local_50;
  
  local_50.outputType = '\x01';
  local_50.indentWidth = 0;
  local_50.currentIndent = 0;
  local_50.indentArray = (adt_bytearray_t *)0x0;
  local_50.destStr = (adt_str_t *)0x0;
  local_50.newLineStr = "\n";
  local_50.sortKeys = false;
  local_50.destFile = fh;
  if (0 < indent) {
    local_50.currentIndent = 0;
    local_50.indentWidth = indent;
    local_50.indentArray = (adt_bytearray_t *)adt_bytearray_new(0x80);
  }
  if (sortKeys) {
    local_50.sortKeys = true;
  }
  dtl_json_writer_write_dv(&local_50,dv,true);
  dtl_json_writer_destroy(&local_50,false);
  return 0;
}

Assistant:

int32_t dtl_json_dump(const dtl_dv_t *dv, FILE *fh, int32_t indent, bool sortKeys)
{
   dtl_json_writer_t writer;
   dtl_json_writer_createWithFile(&writer, fh);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   dtl_json_writer_destroy(&writer, false);
   return 0;
}